

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

CHAR CNNModelPredictBinary56(CharCNNClassifier *model,IplImage *pImage)

{
  uint uVar1;
  INT32U IVar2;
  int iVar3;
  long lVar4;
  char cVar5;
  IplImage *pIVar6;
  ulong uVar7;
  long lVar8;
  INT32U IVar9;
  IplImage *pIVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  bool bVar26;
  undefined8 uStack_90;
  int aiStack_88 [2];
  long local_80;
  long local_78;
  IplImage *local_70;
  long local_68;
  ulong local_60;
  long local_58;
  int local_4c;
  IplImage *local_48;
  CharCNNClassifier *local_40;
  ulong local_38;
  
  lVar12 = -0x88 - ((ulong)((model->model_binary_56).C11.outChannels * 0xa9) * 4 + 0xf &
                   0xfffffffffffffff0);
  local_58 = (long)aiStack_88 +
             (lVar12 - ((ulong)(model->model_binary_56).FC1.inputNum * 4 + 0xf & 0xfffffffffffffff0)
             ) + 0x88;
  lVar8 = local_58 - ((ulong)(model->model_binary_56).FC1.outputNum * 4 + 0xf & 0xfffffffffffffff0);
  local_68 = lVar8;
  uVar1 = (model->model_binary_56).C11.outChannels;
  pIVar6 = (IplImage *)(ulong)uVar1;
  local_40 = model;
  local_48 = pImage;
  if (uVar1 != 0) {
    local_38 = 0;
    pIVar10 = (IplImage *)0x0;
    do {
      local_4c = Binary56_C11_B_Weight[(long)pIVar10];
      local_78 = (long)aiStack_88 + ((long)pIVar10 * 0xa900000000 >> 0x1e) + lVar12 + 0x88;
      uVar7 = 0;
      local_70 = pIVar10;
      do {
        local_80 = uVar7 * 0x34 + local_78;
        lVar25 = 0;
        local_60 = uVar7;
        do {
          IVar2 = (local_40->model_binary_56).C11.height;
          if (IVar2 == 0) {
            iVar15 = 0;
          }
          else {
            uVar1 = (local_40->model_binary_56).C11.widthStep;
            IVar9 = 0;
            uVar11 = local_60 & 0xffffffff;
            iVar15 = 0;
            uVar7 = local_38;
            do {
              if ((ulong)uVar1 != 0) {
                iVar18 = local_48->widthStep * (int)uVar11 + (int)lVar25;
                uVar17 = uVar7 & 0xffffffff;
                uVar20 = (ulong)uVar1;
                do {
                  iVar15 = iVar15 + (uint)local_48->imageData[iVar18] *
                                    Binary56_C11_Map_Weight[(int)uVar17];
                  iVar18 = iVar18 + 1;
                  uVar17 = (ulong)((int)uVar17 + 1);
                  uVar20 = uVar20 - 1;
                } while (uVar20 != 0);
              }
              IVar9 = IVar9 + 1;
              uVar11 = (ulong)((int)uVar11 + 1);
              uVar7 = (ulong)((int)uVar7 + uVar1);
            } while (IVar9 != IVar2);
          }
          iVar15 = iVar15 + local_4c;
          *(undefined8 *)(lVar8 + -8) = 0x1029d1;
          iVar15 = TanhApproximateFunction(iVar15);
          *(int *)(local_80 + lVar25 * 4) = iVar15;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 0xd);
        uVar7 = local_60 + 1;
      } while (uVar7 != 0xd);
      pIVar10 = (IplImage *)((long)&local_70->height + 1);
      pIVar6 = (IplImage *)(ulong)(local_40->model_binary_56).C11.outChannels;
      local_38 = (ulong)((int)local_38 + 9);
    } while (pIVar10 < pIVar6);
  }
  lVar4 = local_58;
  lVar25 = local_68;
  if ((int)pIVar6 != 0) {
    local_48 = pIVar6;
    iVar15 = 0;
    pIVar10 = (IplImage *)0x0;
    do {
      lVar16 = 0;
      iVar18 = iVar15;
      do {
        lVar21 = 0;
        iVar19 = iVar18;
        do {
          iVar13 = -10;
          iVar24 = 0;
          iVar23 = iVar19;
          do {
            lVar22 = 0;
            do {
              iVar3 = *(int *)((long)aiStack_88 + (long)(iVar23 + (int)lVar22) * 4 + lVar12 + 0x88);
              if (iVar13 < iVar3) {
                iVar13 = iVar3;
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 == 1);
            iVar23 = iVar23 + 0xd;
            bVar26 = iVar24 == 0;
            iVar24 = iVar24 + 1;
          } while (bVar26);
          *(int *)((((long)pIVar10 << 0x22) * 9 >> 0x1e) + local_58 + lVar16 * 0x18 + lVar21 * 4) =
               iVar13;
          lVar21 = lVar21 + 1;
          iVar19 = iVar19 + 2;
        } while (lVar21 != 6);
        lVar16 = lVar16 + 1;
        iVar18 = iVar18 + 0x1a;
      } while (lVar16 != 6);
      pIVar10 = (IplImage *)((long)&pIVar10->height + 1);
      iVar15 = iVar15 + 0xa9;
    } while (pIVar10 != pIVar6);
  }
  if ((local_40->model_binary_56).FC1.outputNum != 0) {
    uVar7 = 0;
    do {
      uVar1 = (local_40->model_binary_56).FC1.inputNum;
      iVar15 = 0;
      if ((ulong)uVar1 != 0) {
        uVar11 = 0;
        iVar15 = 0;
        do {
          iVar15 = iVar15 + Binary56_FC1_Map_Weight[uVar1 * (int)uVar7 + (int)uVar11] *
                            *(int *)(lVar4 + uVar11 * 4);
          uVar11 = uVar11 + 1;
        } while (uVar1 != uVar11);
      }
      iVar18 = Binary56_FC1_B_Weight[uVar7];
      *(undefined8 *)(lVar8 + -8) = 0x102b1c;
      iVar15 = TanhApproximateFunction(iVar15 + iVar18);
      *(int *)(lVar25 + uVar7 * 4) = iVar15;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (local_40->model_binary_56).FC1.outputNum);
  }
  uVar7 = (ulong)(local_40->model_binary_56).FC2.outputNum;
  if (uVar7 == 0) {
    cVar5 = '\x05';
  }
  else {
    uVar20 = (ulong)(local_40->model_binary_56).FC2.inputNum;
    lVar12 = 0;
    iVar15 = -10000;
    uVar17 = 0;
    uVar11 = 0;
    do {
      iVar18 = 0;
      if (uVar20 != 0) {
        uVar14 = 0;
        iVar18 = 0;
        do {
          iVar18 = iVar18 + Binary56_FC2_Map_Weight[(uint)((int)lVar12 + (int)uVar14)] *
                            *(int *)(lVar25 + uVar14 * 4);
          uVar14 = uVar14 + 1;
        } while (uVar20 != uVar14);
      }
      if (iVar15 < iVar18 + Binary56_FC2_B_Weight[uVar17]) {
        uVar11 = uVar17 & 0xffffffff;
        iVar15 = iVar18 + Binary56_FC2_B_Weight[uVar17];
      }
      uVar17 = uVar17 + 1;
      lVar12 = lVar12 + uVar20;
    } while (uVar17 != uVar7);
    cVar5 = '\x06' - ((int)uVar11 == 0);
  }
  return cVar5;
}

Assistant:

CHAR CNNModelPredictBinary56(CharCNNClassifier *model, IplImage *pImage) {
    int row, col, i, j, k;
    INT8U output_row, output_col;
    int map_index_position, image_index_position;
    int sum, max, value;
    int c11_output[model->model_binary_56.C11.outChannels * 13 * 13];
//    int c21_output[25 * 11 * 11], c31_output[25 * 9 * 9];
    int merge_output[model->model_binary_56.FC1.inputNum];
    int fc1_output[model->model_binary_56.FC1.outputNum];
// convolution - layer
//    3*3
//    15-3+1=13
    output_row = 13;
    output_col = 13;
    for (k = 0; k < model->model_binary_56.C11.outChannels; k++) {
//        for each filters
        for (i = 0; i < output_row; i++) {
            //        i represents start point in row
            for (j = 0; j < output_col; j++) {
                //        j represents start point in col
                sum = 0;
                for (row = 0; row < model->model_binary_56.C11.height; row++) {
                    for (col = 0; col < model->model_binary_56.C11.widthStep; col++) {
                        //      index position
                        map_index_position = k * 3 * 3 + row * model->model_binary_56.C11.widthStep + col;
                        image_index_position = (i + row) * pImage->widthStep + (j + col);
//                        printf("%d,%d\n", map_index_position, image_index_position);
//                        printf("%ld,%d,%ld\n", C11_Map_Weight[map_index_position],
//                               pImage->imageData[image_index_position],
//                               C11_Map_Weight[map_index_position] * pImage->imageData[image_index_position]);
                        sum += Binary56_C11_Map_Weight[map_index_position] * pImage->imageData[image_index_position];
                    }
                }
                c11_output[k * output_row * output_row + i * output_row + j] = TanhApproximateFunction(
                        sum + Binary56_C11_B_Weight[k]);
//                printf("%ld\n",sum + C11_B_Weight[k]);
            }
        }
//                printmat(pImage);
//        printmat2(c11_output, 13, 13);
//                printf("%f",sum);
//                printf("%f",c11_output[k * 13 * 13 + i * 13 + j]);
//        assert(NULL);
    }


    output_row = 6;
    output_col = 6;
    for (k = 0; k < model->model_binary_56.C11.outChannels; k++) {
//        for each filters
        for (i = 0; i < output_row; i++) {
            //        i represents start point in row
            for (j = 0; j < output_col; j++) {
                //        j represents start point in col
                max = -10;
                for (row = 0; row < 2; row++) {
                    for (col = 0; col < 2; col++) {
                        value = c11_output[k * 13 * 13 + (2 * i + row) * 13 + (2 * j + col)];
                        if (value > max) {
                            max = value;
                        }

                    }
                }
                merge_output[k * 6 * 6 + i * 6 + j] = max;
            }
        }
//        printmat2(merge_output, 6, 6);
//                printf("%f",sum);
//                printf("%f",c11_output[k * 13 * 13 + i * 13 + j]);
//        assert(NULL);
    }
    //endregion


    //region FC1 - 360*40

    for (row = 0; row < model->model_binary_56.FC1.outputNum; row++) {
        sum = 0;
        for (col = 0; col < model->model_binary_56.FC1.inputNum; col++) {
            sum += merge_output[col] * Binary56_FC1_Map_Weight[row * model->model_binary_56.FC1.inputNum + col];
        }
//        fc1_output[row] = tanhf(sum + FC1_B_Weight[row]);
        fc1_output[row] = TanhApproximateFunction(sum + Binary56_FC1_B_Weight[row]);
//        fc1_output[row] = sum + FC1_B_Weight[row];
    }
    //endregion

//    for (col = 0; col < model->model_binary_56.FC2.inputNum; col++) {
//        printf("%f,",fc1_output[col]);
//    }
//    printf("\n");
//
//    for (col = 0; col < model->model_binary_56.FC2.inputNum; col++) {
//        printf("%f,",FC2_Map_Weight[7*model->model_binary_56.FC2.inputNum+col]);
//    }
//    printf("\n");
//    for (col = 0; col < model->model_binary_56.FC2.inputNum; col++) {
//        printf("%f,",FC2_Map_Weight[33*model->model_binary_56.FC2.inputNum+col]);
//    }
//    printf("\n");
    //region FC2 - 40*34
    max = -10000;
    k = 0;

    for (row = 0; row < model->model_binary_56.FC2.outputNum; row++) {
        sum = 0;
        for (col = 0; col < model->model_binary_56.FC2.inputNum; col++) {
//            printf("%d,%d\n",fc1_output[col],FC2_Map_Weight[row * model->model_binary_56.FC2.inputNum + col]);
            sum += fc1_output[col] * Binary56_FC2_Map_Weight[row * model->model_binary_56.FC2.inputNum + col];
        }
        value = sum + Binary56_FC2_B_Weight[row];
//        printf("%ld\n",value);
        if (value > max) {
            max = value;
            k = row;
        }
    }
    //endregion

//    printf("%f,%d\n",max,k);
    if (k == 0)
        return 5;
    else
        return 6;
//    return '1' ;
}